

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O0

int num_length(uint number)

{
  undefined4 local_14;
  undefined4 local_10;
  uint count;
  uint number_local;
  
  if (number == 0) {
    count = 2;
  }
  else {
    local_14 = 1;
    for (local_10 = number; local_10 != 0; local_10 = local_10 / 10) {
      local_14 = local_14 + 1;
    }
    count = local_14;
  }
  return count;
}

Assistant:

int
num_length(unsigned number)
{
  if (number) {
    unsigned count = 1;
    while (number > 0) {
      number /= 10;
      ++count;
    }
    return count;
  } else
    return 2;
}